

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompOpEvalLast(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *last)

{
  int *piVar1;
  xmlXPathContextPtr ctxt_00;
  xmlXPathCompExprPtr pxVar2;
  long lVar4;
  int iVar5;
  xmlXPathOp xVar6;
  int iVar7;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar8;
  xmlXPathObjectPtr pxVar9;
  ulong uVar3;
  
  if (ctxt->error != 0) {
    return 0;
  }
  if ((ctxt->context->opLimit != 0) && (iVar5 = xmlXPathCheckOpLimit(ctxt,1), iVar5 < 0)) {
    return 0;
  }
  ctxt_00 = ctxt->context;
  if (4999 < ctxt_00->depth) {
    iVar5 = 0x1a;
LAB_001e688f:
    xmlXPathErr(ctxt,iVar5);
    return 0;
  }
  ctxt_00->depth = ctxt_00->depth + 1;
  xVar6 = op->op;
  if (10 < xVar6 - XPATH_OP_UNION) {
    if (xVar6 == XPATH_OP_END) goto LAB_001e6b70;
switchD_001e68c0_caseD_c:
    xVar6 = xmlXPathCompOpEval(ctxt,op);
    goto LAB_001e6b70;
  }
  pxVar2 = ctxt->comp;
  switch(xVar6) {
  case XPATH_OP_UNION:
    xVar6 = xmlXPathCompOpEvalLast(ctxt,pxVar2->steps + op->ch1,last);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar9 = ctxt->value;
    if (((pxVar9 != (xmlXPathObjectPtr)0x0) && (pxVar9->type == XPATH_NODESET)) &&
       (pxVar8 = pxVar9->nodesetval, pxVar8 != (xmlNodeSetPtr)0x0)) {
      iVar5 = pxVar8->nodeNr;
      if (0 < (long)iVar5) {
        if (iVar5 != 1) {
          libxml_domnode_tim_sort(pxVar8->nodeTab,(long)iVar5);
        }
        pxVar8 = ctxt->value->nodesetval;
        *last = pxVar8->nodeTab[(long)pxVar8->nodeNr + -1];
      }
    }
    iVar5 = xmlXPathCompOpEvalLast(ctxt,pxVar2->steps + op->ch2,last);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar9 = valuePop(ctxt);
    obj = valuePop(ctxt);
    if (((obj == (xmlXPathObjectPtr)0x0) ||
        (pxVar9 == (xmlXPathObjectPtr)0x0 || obj->type != XPATH_NODESET)) ||
       (pxVar9->type != XPATH_NODESET)) {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar9);
      iVar5 = 0xb;
      goto LAB_001e688f;
    }
    if ((ctxt->context->opLimit == 0) ||
       (((obj->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar7 = xmlXPathCheckOpLimit(ctxt,(long)obj->nodesetval->nodeNr), -1 < iVar7)) &&
        ((pxVar9->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar7 = xmlXPathCheckOpLimit(ctxt,(long)pxVar9->nodesetval->nodeNr), -1 < iVar7)))))) {
      pxVar8 = xmlXPathNodeSetMerge(obj->nodesetval,pxVar9->nodesetval);
      obj->nodesetval = pxVar8;
      valuePush(ctxt,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar9);
      if (iVar5 < (int)xVar6) {
        lVar4._0_4_ = op->ch1;
        lVar4._4_4_ = op->ch2;
        uVar3._0_4_ = op->ch1;
        uVar3._4_4_ = op->ch2;
        uVar3 = lVar4 << 0x20 | uVar3 >> 0x20;
        op->ch1 = (int)uVar3;
        op->ch2 = (int)(uVar3 >> 0x20);
      }
      xVar6 = iVar5 + xVar6;
    }
    else {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar9);
    }
    goto LAB_001e6b70;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    break;
  case XPATH_OP_NODE:
    xVar6 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar5 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      xVar6 = iVar5 + xVar6;
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar9 = xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
    valuePush(ctxt,pxVar9);
    goto LAB_001e6b70;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar5 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar7 = xmlXPathNodeCollectAndTest(ctxt,op,(xmlNodePtr *)0x0,last,0);
      xVar6 = iVar7 + iVar5;
      goto LAB_001e6b70;
    }
    break;
  case XPATH_OP_VALUE:
    pxVar9 = xmlXPathCacheObjectCopy(ctxt_00,(xmlXPathObjectPtr)op->value4);
    valuePush(ctxt,pxVar9);
    break;
  default:
    goto switchD_001e68c0_caseD_c;
  case XPATH_OP_SORT:
    xVar6 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar6 = xmlXPathCompOpEvalLast(ctxt,pxVar2->steps + op->ch1,last);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar9 = ctxt->value;
    if ((((pxVar9 != (xmlXPathObjectPtr)0x0) && (pxVar9->type == XPATH_NODESET)) &&
        (pxVar8 = pxVar9->nodesetval, pxVar8 != (xmlNodeSetPtr)0x0)) && (1 < (long)pxVar8->nodeNr))
    {
      libxml_domnode_tim_sort(pxVar8->nodeTab,(long)pxVar8->nodeNr);
    }
    goto LAB_001e6b70;
  }
  xVar6 = XPATH_OP_END;
LAB_001e6b70:
  piVar1 = &ctxt->context->depth;
  *piVar1 = *piVar1 + -1;
  return xVar6;
}

Assistant:

static int
xmlXPathCompOpEvalLast(xmlXPathParserContextPtr ctxt, xmlXPathStepOpPtr op,
                       xmlNodePtr * last)
{
    int total = 0, cur;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_UNION:
            total =
                xmlXPathCompOpEvalLast(ctxt, &comp->steps[op->ch1], last);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) {
                /*
                 * limit tree traversing to first node in the result
                 */
		if (ctxt->value->nodesetval->nodeNr > 1)
		    xmlXPathNodeSetSort(ctxt->value->nodesetval);
                *last =
                    ctxt->value->nodesetval->nodeTab[ctxt->value->
                                                     nodesetval->nodeNr -
                                                     1];
            }
            cur =
                xmlXPathCompOpEvalLast(ctxt, &comp->steps[op->ch2], last);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) { /* TODO: NOP ? */
            }

            arg2 = valuePop(ctxt);
            arg1 = valuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

            /* TODO: Check memory error. */
            arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
                                                    arg2->nodesetval);
            valuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            /* optimizer */
	    if (total > cur)
		xmlXPathCompSwap(op);
            total += cur;
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
		ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, NULL, last, 0);
                break;
            }
        case XPATH_OP_VALUE:
            valuePush(ctxt,
                      xmlXPathCacheObjectCopy(ctxt->context,
			(xmlXPathObjectPtr) op->value4));
            break;
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total +=
                    xmlXPathCompOpEvalLast(ctxt, &comp->steps[op->ch1],
                                           last);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
		&& (ctxt->value->nodesetval->nodeNr > 1))
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
            break;
        default:
            total += xmlXPathCompOpEval(ctxt, op);
            break;
    }

    ctxt->context->depth -= 1;
    return (total);
}